

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

bool ImGui::Begin(char *name,bool *p_open,ImVec2 *size_first_use,float bg_alpha_override,
                 ImGuiWindowFlags flags)

{
  ImGuiContext *pIVar1;
  bool bVar2;
  
  pIVar1 = GImGui;
  if ((((size_first_use->x != 0.0) || (NAN(size_first_use->x))) || (size_first_use->y != 0.0)) ||
     (NAN(size_first_use->y))) {
    (GImGui->NextWindowData).SizeVal = *size_first_use;
    (pIVar1->NextWindowData).SizeCond = 4;
  }
  pIVar1 = GImGui;
  if (0.0 <= bg_alpha_override) {
    (GImGui->NextWindowData).BgAlphaVal = bg_alpha_override;
    (pIVar1->NextWindowData).BgAlphaCond = 1;
  }
  bVar2 = Begin(name,p_open,flags);
  return bVar2;
}

Assistant:

bool ImGui::Begin(const char* name, bool* p_open, const ImVec2& size_first_use, float bg_alpha_override, ImGuiWindowFlags flags)
{
    // Old API feature: we could pass the initial window size as a parameter. This was misleading because it only had an effect if the window didn't have data in the .ini file.
    if (size_first_use.x != 0.0f || size_first_use.y != 0.0f)
        ImGui::SetNextWindowSize(size_first_use, ImGuiCond_FirstUseEver);

    // Old API feature: override the window background alpha with a parameter.
    if (bg_alpha_override >= 0.0f)
        ImGui::SetNextWindowBgAlpha(bg_alpha_override);

    return ImGui::Begin(name, p_open, flags);
}